

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O0

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 Distributions::convolve
           (vector<double,_std::allocator<double>_> *dist1,
           vector<double,_std::allocator<double>_> *dist2,int offset1,int offset2,int *offset_result
           )

{
  void *__s;
  size_type sVar1;
  size_type sVar2;
  vector<double,_std::allocator<double>_> *this;
  const_reference pvVar3;
  pointer pvVar4;
  int in_ECX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
  in_RDI;
  int in_R8D;
  int *in_R9;
  int i;
  double p;
  int n;
  int rightmost_nonzero;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  pointer in_stack_ffffffffffffff48;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff50;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffff58;
  int iVar6;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  int local_60 [5];
  int local_4c [3];
  double local_40;
  int local_34;
  undefined4 local_30;
  undefined1 local_29;
  int *local_28;
  int local_20;
  int local_1c;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_29 = 0;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  __s = operator_new(0x18);
  memset(__s,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a3753);
  std::
  unique_ptr<std::vector<double,std::allocator<double>>,std::default_delete<std::vector<double,std::allocator<double>>>>
  ::unique_ptr<std::default_delete<std::vector<double,std::allocator<double>>>,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *local_28 = local_1c + local_20;
  local_30 = 0xffffffff;
  local_34 = 0;
  while( true ) {
    iVar6 = local_34;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_10);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
    if ((int)sVar1 + (int)sVar2 + -2 < iVar6) break;
    local_40 = 0.0;
    local_4c[1] = 0;
    in_stack_ffffffffffffff6c = local_34;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
    local_4c[0] = (in_stack_ffffffffffffff6c - (int)sVar1) + 1;
    in_stack_ffffffffffffff70 =
         (vector<double,_std::allocator<double>_> *)std::max<int>(local_4c + 1,local_4c);
    local_4c[2] = *(int *)&(in_stack_ffffffffffffff70->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
    while( true ) {
      iVar6 = local_4c[2];
      sVar1 = std::vector<double,_std::allocator<double>_>::size(local_10);
      local_60[0] = (int)sVar1 + -1;
      this = (vector<double,_std::allocator<double>_> *)std::min<int>(&local_34,local_60);
      if (*(int *)&(this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start < iVar6) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_4c[2]);
      vVar5 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_34 - local_4c[2]));
      local_40 = vVar5 * *pvVar3 + local_40;
      local_4c[2] = local_4c[2] + 1;
    }
    pvVar4 = std::
             unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                           *)0x2a38fe);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
    if (((sVar1 != 0) || (local_40 != 0.0)) || (NAN(local_40))) {
      if ((local_40 != 0.0) || (NAN(local_40))) {
        pvVar4 = std::
                 unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                               *)0x2a394b);
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        local_30 = (undefined4)sVar1;
      }
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a3964);
      std::vector<double,_std::allocator<double>_>::push_back
                (this,(value_type_conflict4 *)CONCAT44(iVar6,in_stack_ffffffffffffff58));
    }
    else {
      *local_28 = *local_28 + 1;
    }
    local_34 = local_34 + 1;
  }
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                *)0x2a3995);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
            );
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(tuple<std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>.
             _M_head_impl;
}

Assistant:

unique_ptr<vector<double> > Distributions::convolve(const vector<double>& dist1, const vector<double>& dist2, int offset1, int offset2, int* offset_result) {
	unique_ptr<vector<double> > result(new vector<double>());
	*offset_result = offset1 + offset2;
	int rightmost_nonzero = -1;
	for (int n = 0; n <= ((int)(dist1.size()+dist2.size()))-2; ++n) {
		double p = 0.0;
		for (int i = max(0, n-((int)dist2.size())+1); i <= min(n, ((int)dist1.size())-1); ++i) {
			p += dist1[i]*dist2[n-i];
		}
		if ((result->size() == 0) && (p == 0.0)) {
			*offset_result += 1;
			continue;
		}
		if (p != 0.0) {
			rightmost_nonzero = result->size();
		}
		result->push_back(p);
	}
	result->resize(rightmost_nonzero+1);
	return result;
}